

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Texture2D * LoadTextureFromImage(Image image)

{
  uint uVar1;
  Texture2D *in_RDI;
  void *in_stack_00000008;
  
  memset(in_RDI,0,0x14);
  if (((in_stack_00000008 == (void *)0x0) || ((int)image.data == 0)) || (image.data._4_4_ == 0)) {
    TraceLog(4,"IMAGE: Data is not valid to load texture");
  }
  else {
    uVar1 = rlLoadTexture(in_stack_00000008,(int)image.data,image.data._4_4_,image.height,
                          image.width);
    in_RDI->id = uVar1;
  }
  in_RDI->width = (int)image.data;
  in_RDI->height = image.data._4_4_;
  in_RDI->mipmaps = image.width;
  in_RDI->format = image.height;
  return in_RDI;
}

Assistant:

Texture2D LoadTextureFromImage(Image image)
{
    Texture2D texture = { 0 };

    if ((image.data != NULL) && (image.width != 0) && (image.height != 0))
    {
        texture.id = rlLoadTexture(image.data, image.width, image.height, image.format, image.mipmaps);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Data is not valid to load texture");

    texture.width = image.width;
    texture.height = image.height;
    texture.mipmaps = image.mipmaps;
    texture.format = image.format;

    return texture;
}